

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O3

int Abc_NodeMakeSCCFree(Abc_Obj_t *pNode)

{
  size_t __n;
  uint uVar1;
  long lVar2;
  int iVar3;
  char *__src;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  undefined1 *__dest;
  
  __src = (char *)(pNode->field_5).pData;
  if (*__src != '\0') {
    uVar1 = (pNode->vFanins).nSize;
    lVar2 = (long)(int)uVar1;
    __n = lVar2 + 3;
    iVar3 = 0;
    pcVar4 = __src;
    do {
      cVar6 = pcVar4[lVar2 + 3];
      if (cVar6 == '\0') break;
      pcVar5 = pcVar4 + lVar2 + 3;
      do {
        if ((cVar6 != 'z') && (*pcVar4 != 'z')) {
          pcVar8 = pcVar5;
          if (0 < (int)uVar1) {
            bVar9 = true;
            uVar7 = 0;
            do {
              if ((pcVar4[uVar7] != pcVar5[uVar7]) &&
                 ((pcVar4[uVar7] == '-' || (bVar9 = false, pcVar5[uVar7] != '-'))))
              goto LAB_001c9334;
              uVar7 = uVar7 + 1;
            } while (uVar1 != uVar7);
            if (!bVar9) {
              pcVar8 = pcVar4;
            }
          }
          iVar3 = iVar3 + 1;
          *pcVar8 = 'z';
        }
LAB_001c9334:
        cVar6 = pcVar5[__n];
        pcVar5 = pcVar5 + __n;
      } while (cVar6 != '\0');
      pcVar5 = pcVar4 + __n;
      pcVar4 = pcVar4 + __n;
    } while (*pcVar5 != '\0');
    if (iVar3 != 0) {
      __dest = (undefined1 *)(pNode->field_5).pData;
      do {
        if (*__src != 'z') {
          if (*__src == '\0') {
            *__dest = 0;
            return 1;
          }
          memcpy(__dest,__src,__n);
          __dest = __dest + __n;
        }
        __src = __src + __n;
      } while( true );
    }
  }
  return 0;
}

Assistant:

int Abc_NodeMakeSCCFree( Abc_Obj_t * pNode )
{
    char * pSop = (char *)pNode->pData;
    char * pCube, * pCube2, * pSopNew;
    int nVars = Abc_ObjFaninNum(pNode);
    int Status, nCount = 0;
    Abc_SopForEachCubePair( pSop, nVars, pCube, pCube2 )
    {
        if ( pCube[0] == 'z' || pCube2[0] == 'z' )
            continue;
        Status = Abc_CubeContain( pCube, pCube2, nVars );
        nCount += (int)(Status > 0);
        if ( Status & 1 )
            pCube2[0] = 'z';
        else if ( Status & 2 )
            pCube[0] = 'z';
    }
    if ( nCount == 0 )
        return 0;
    // create new cover
    pSopNew = (char *)pNode->pData;
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        if ( pCube[0] == 'z' )
            continue;
        memcpy( pSopNew, pCube, nVars + 3 );
        pSopNew += nVars + 3;
    }
    *pSopNew = 0;
    return 1;
}